

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

void vp8hwdDecodeCoeffUpdate(VP8DParserContext_t *p)

{
  RK_U32 RVar1;
  uint local_20;
  uint local_1c;
  RK_U32 l;
  RK_U32 k;
  RK_U32 j;
  RK_U32 i;
  VP8DParserContext_t *p_local;
  
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",800,
               "vp8hwdDecodeCoeffUpdate");
  }
  for (k = 0; k < 4; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
          RVar1 = vp8hwdDecodeBool(&p->bitstr,(uint)CoeffUpdateProbs[k][l][local_1c][local_20]);
          if (RVar1 != 0) {
            RVar1 = vp8hwdReadBits(&p->bitstr,8);
            (p->entropy).probCoeffs[k][l][local_1c][local_20] = (RK_U8)RVar1;
          }
        }
      }
    }
  }
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x32d,
               "vp8hwdDecodeCoeffUpdate");
  }
  return;
}

Assistant:

static void vp8hwdDecodeCoeffUpdate(VP8DParserContext_t *p)
{
    RK_U32 i, j, k, l;

    FUN_T("FUN_IN");
    for ( i = 0; i < 4; i++ ) {
        for ( j = 0; j < 8; j++ ) {
            for ( k = 0; k < 3; k++ ) {
                for ( l = 0; l < 11; l++ ) {
                    if (vp8hwdDecodeBool(&p->bitstr,
                                         CoeffUpdateProbs[i][j][k][l]))
                        p->entropy.probCoeffs[i][j][k][l] =
                            vp8hwdReadBits(&p->bitstr, 8);
                }
            }
        }
    }
    FUN_T("FUN_OUT");
}